

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O0

int check_long_opt(int argc,char **argv,char *optstring,option *longopts,int *longind,
                  int print_errors,custom_getopt_data *d)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long *in_RCX;
  char *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  int *in_R8;
  int in_R9D;
  bool bVar6;
  int *in_stack_00000008;
  int option_index;
  int indfound;
  int ambig;
  int exact;
  option *pfound;
  option *p;
  char *nameend;
  char local_61;
  int local_58;
  int local_54;
  long *local_48;
  long *local_40;
  char *local_38;
  int local_4;
  
  local_48 = (long *)0x0;
  bVar3 = false;
  bVar2 = false;
  local_54 = -1;
  local_38 = *(char **)(in_stack_00000008 + 8);
  while( true ) {
    bVar6 = false;
    if (*local_38 != '\0') {
      bVar6 = *local_38 != '=';
    }
    if (!bVar6) break;
    local_38 = local_38 + 1;
  }
  local_58 = 0;
  local_40 = in_RCX;
  do {
    if (*local_40 == 0) {
LAB_00145d12:
      if ((!bVar2) || (bVar3)) {
        if (local_48 == (long *)0x0) {
          if (in_R9D != 0) {
            if (*(char *)(in_RSI[*in_stack_00000008] + 1) == '-') {
              fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*in_RSI,
                      *(undefined8 *)(in_stack_00000008 + 8));
            }
            else {
              fprintf(_stderr,"%s: unrecognized option `%c%s\'\n",*in_RSI,
                      (ulong)(uint)(int)*(char *)in_RSI[*in_stack_00000008],
                      *(undefined8 *)(in_stack_00000008 + 8));
            }
          }
          *(char **)(in_stack_00000008 + 8) = "";
          *in_stack_00000008 = *in_stack_00000008 + 1;
          in_stack_00000008[2] = 0;
          local_4 = 0x3f;
        }
        else {
          *in_stack_00000008 = *in_stack_00000008 + 1;
          if (*local_38 == '\0') {
            if ((int)local_48[1] == 1) {
              if (in_EDI <= *in_stack_00000008) {
                if (in_R9D != 0) {
                  fprintf(_stderr,"%s: option `%s\' requires an argument\n",*in_RSI,
                          in_RSI[*in_stack_00000008 + -1]);
                }
                sVar5 = strlen(*(char **)(in_stack_00000008 + 8));
                *(size_t *)(in_stack_00000008 + 8) = sVar5 + *(long *)(in_stack_00000008 + 8);
                in_stack_00000008[2] = (int)local_48[3];
                local_61 = ':';
                if (*in_RDX != ':') {
                  local_61 = '?';
                }
                return (int)local_61;
              }
              iVar4 = *in_stack_00000008;
              *in_stack_00000008 = iVar4 + 1;
              *(undefined8 *)(in_stack_00000008 + 4) = in_RSI[iVar4];
            }
          }
          else {
            if ((int)local_48[1] == 0) {
              if (in_R9D != 0) {
                if (*(char *)(in_RSI[*in_stack_00000008 + -1] + 1) == '-') {
                  fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*in_RSI,
                          *local_48);
                }
                else {
                  fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*in_RSI,
                          (ulong)(uint)(int)*(char *)in_RSI[*in_stack_00000008 + -1],*local_48);
                }
              }
              sVar5 = strlen(*(char **)(in_stack_00000008 + 8));
              *(size_t *)(in_stack_00000008 + 8) = sVar5 + *(long *)(in_stack_00000008 + 8);
              in_stack_00000008[2] = (int)local_48[3];
              return 0x3f;
            }
            *(char **)(in_stack_00000008 + 4) = local_38 + 1;
          }
          sVar5 = strlen(*(char **)(in_stack_00000008 + 8));
          *(size_t *)(in_stack_00000008 + 8) = sVar5 + *(long *)(in_stack_00000008 + 8);
          if (in_R8 != (int *)0x0) {
            *in_R8 = local_54;
          }
          if (local_48[2] == 0) {
            local_4 = (int)local_48[3];
          }
          else {
            *(int *)local_48[2] = (int)local_48[3];
            local_4 = 0;
          }
        }
      }
      else {
        if (in_R9D != 0) {
          fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*in_RSI,in_RSI[*in_stack_00000008]);
        }
        sVar5 = strlen(*(char **)(in_stack_00000008 + 8));
        *(size_t *)(in_stack_00000008 + 8) = sVar5 + *(long *)(in_stack_00000008 + 8);
        *in_stack_00000008 = *in_stack_00000008 + 1;
        in_stack_00000008[2] = 0;
        local_4 = 0x3f;
      }
      return local_4;
    }
    iVar4 = strncmp((char *)*local_40,*(char **)(in_stack_00000008 + 8),
                    (long)local_38 - *(long *)(in_stack_00000008 + 8));
    if (iVar4 == 0) {
      uVar1 = *(undefined8 *)(in_stack_00000008 + 8);
      sVar5 = strlen((char *)*local_40);
      if ((int)local_38 - (int)uVar1 == (int)sVar5) {
        local_48 = local_40;
        local_54 = local_58;
        bVar3 = true;
        goto LAB_00145d12;
      }
      if (local_48 == (long *)0x0) {
        local_48 = local_40;
        local_54 = local_58;
      }
      else if ((((int)local_48[1] != (int)local_40[1]) || (local_48[2] != local_40[2])) ||
              ((int)local_48[3] != (int)local_40[3])) {
        bVar2 = true;
      }
    }
    local_40 = local_40 + 4;
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

static int check_long_opt(int argc, char *const *argv, const char *optstring,
		const struct option *longopts, int *longind,
		int print_errors, struct custom_getopt_data *d)
{
	char *nameend;
	const struct option *p;
	const struct option *pfound = NULL;
	int exact = 0;
	int ambig = 0;
	int indfound = -1;
	int option_index;

	for (nameend = d->nextchar; *nameend && *nameend != '='; nameend++)
		/* Do nothing.  */ ;

	/* Test all long options for either exact match or abbreviated matches */
	for (p = longopts, option_index = 0; p->name; p++, option_index++)
		if (!strncmp(p->name, d->nextchar, nameend - d->nextchar)) {
			if ((unsigned int) (nameend - d->nextchar)
					== (unsigned int) strlen(p->name)) {
				/* Exact match found.  */
				pfound = p;
				indfound = option_index;
				exact = 1;
				break;
			} else if (pfound == NULL) {
				/* First nonexact match found.  */
				pfound = p;
				indfound = option_index;
			} else if (pfound->has_arg != p->has_arg
					|| pfound->flag != p->flag
					|| pfound->val != p->val)
				/* Second or later nonexact match found.  */
				ambig = 1;
		}
	if (ambig && !exact) {
		if (print_errors) {
			fprintf(stderr,
				"%s: option `%s' is ambiguous\n",
				argv[0], argv[d->custom_optind]);
		}
		d->nextchar += strlen(d->nextchar);
		d->custom_optind++;
		d->custom_optopt = 0;
		return '?';
	}
	if (pfound) {
		option_index = indfound;
		d->custom_optind++;
		if (*nameend) {
			if (pfound->has_arg != no_argument)
				d->custom_optarg = nameend + 1;
			else {
				if (print_errors) {
					if (argv[d->custom_optind - 1][1] == '-') {
						/* --option */
						fprintf(stderr, "%s: option `--%s' doesn't allow an argument\n",
							argv[0], pfound->name);
					} else {
						/* +option or -option */
						fprintf(stderr, "%s: option `%c%s' doesn't allow an argument\n",
							argv[0], argv[d->custom_optind - 1][0], pfound->name);
					}

				}
				d->nextchar += strlen(d->nextchar);
				d->custom_optopt = pfound->val;
				return '?';
			}
		} else if (pfound->has_arg == required_argument) {
			if (d->custom_optind < argc)
				d->custom_optarg = argv[d->custom_optind++];
			else {
				if (print_errors) {
					fprintf(stderr,
						"%s: option `%s' requires an argument\n",
						argv[0],
						argv[d->custom_optind - 1]);
				}
				d->nextchar += strlen(d->nextchar);
				d->custom_optopt = pfound->val;
				return optstring[0] == ':' ? ':' : '?';
			}
		}
		d->nextchar += strlen(d->nextchar);
		if (longind != NULL)
			*longind = option_index;
		if (pfound->flag) {
			*(pfound->flag) = pfound->val;
			return 0;
		}
		return pfound->val;
	}
	/*
	 * Can't find it as a long option.  If this is not getopt_long_only, or
	 * the option starts with '--' or is not a valid short option, then
	 * it's an error.  Otherwise interpret it as a short option.
	 */
	if (print_errors) {
		if (argv[d->custom_optind][1] == '-') {
			/* --option */
			fprintf(stderr,
				"%s: unrecognized option `--%s'\n",
				argv[0], d->nextchar);
		} else {
			/* +option or -option */
			fprintf(stderr,
				"%s: unrecognized option `%c%s'\n",
				argv[0], argv[d->custom_optind][0],
				d->nextchar);
		}
	}
	d->nextchar = (char *) "";
	d->custom_optind++;
	d->custom_optopt = 0;
	return '?';
}